

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

string * anon_unknown.dwarf_114bc3::randomWord
                   (bool alphaNumeric,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *options)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  undefined1 *puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  byte in_SIL;
  string *in_RDI;
  int index;
  int l;
  int length;
  string *word;
  int in_stack_ffffffffffffff54;
  allocator<char> *in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff67;
  size_type in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char local_34;
  int local_30;
  allocator<char> local_1e;
  undefined1 local_1d;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 == 0) {
    local_1c = random_int(in_stack_ffffffffffffff54);
    local_1d = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,in_stack_ffffffffffffff58);
    std::allocator<char>::~allocator(&local_1e);
    for (local_30 = 0; local_30 < local_1c; local_30 = local_30 + 1) {
      if ((local_9 & 1) == 0) {
        iVar1 = random_int(in_stack_ffffffffffffff54);
        in_stack_ffffffffffffff54 = CONCAT13((char)iVar1,(int3)in_stack_ffffffffffffff54);
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
        *puVar5 = (char)((uint)in_stack_ffffffffffffff54 >> 0x18);
      }
      else {
        iVar1 = random_int(in_stack_ffffffffffffff54);
        local_34 = (char)iVar1;
        if (iVar1 < 0x1a) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
          *pcVar4 = local_34 + 'A';
        }
        else if (iVar1 < 0x34) {
          local_34 = local_34 + 'G';
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
          *pcVar4 = local_34;
        }
        else {
          local_34 = local_34 + -4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
          *pcVar4 = local_34;
        }
      }
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(local_18);
    iVar1 = random_int(in_stack_ffffffffffffff54);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,(long)iVar1);
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar3);
  }
  return in_RDI;
}

Assistant:

std::string
randomWord (bool alphaNumeric, const std::vector<std::string>& options)
{
    if (options.size () > 0) { return options[random_int (options.size ())]; }
    else
    {
        int         length = random_int (32);
        std::string word (length, ' ');
        for (int l = 0; l < length; ++l)
        {
            if (alphaNumeric)
            {
                int index =
                    random_int (62); // 26 letters*2 for case + 10 digits
                if (index < 26) { word[l] = 'A' + index; }
                else if (index < 52)
                {
                    word[l] = 'a' + (index - 26);
                }
                else
                {
                    word[l] = '0' + (index - 52);
                }
            }
            else
            {
                word[l] = random_int (256);
            }
        }
        return word;
    }
}